

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddAddWalsh.c
# Opt level: O0

DdNode * Cudd_addWalsh(DdManager *dd,DdNode **x,DdNode **y,int n)

{
  DdNode *pDVar1;
  DdNode *res;
  int n_local;
  DdNode **y_local;
  DdNode **x_local;
  DdManager *dd_local;
  
  do {
    dd->reordered = 0;
    pDVar1 = addWalshInt(dd,x,y,n);
  } while (dd->reordered == 1);
  return pDVar1;
}

Assistant:

DdNode *
Cudd_addWalsh(
  DdManager * dd,
  DdNode ** x,
  DdNode ** y,
  int  n)
{
    DdNode *res;

    do {
        dd->reordered = 0;
        res = addWalshInt(dd, x, y, n);
    } while (dd->reordered == 1);
    return(res);

}